

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_struct_desc(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "private static final org.apache.thrift.protocol.TStruct STRUCT_DESC = new org.apache.thrift.protocol.TStruct(\""
             ,0x6e);
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)CONCAT44(extraout_var,iVar1),
                      ((undefined8 *)CONCAT44(extraout_var,iVar1))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\");",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_struct_desc(ostream& out, t_struct* tstruct) {
  indent(out) << "private static final org.apache.thrift.protocol.TStruct STRUCT_DESC = new "
                 "org.apache.thrift.protocol.TStruct(\"" << tstruct->get_name() << "\");" << endl;
}